

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O0

int redisGetReply(redisContext *c,void **reply)

{
  int iVar1;
  void *local_30;
  void *aux;
  void **ppvStack_20;
  int wdone;
  void **reply_local;
  redisContext *c_local;
  
  aux._4_4_ = 0;
  local_30 = (void *)0x0;
  ppvStack_20 = reply;
  reply_local = &c->funcs;
  iVar1 = redisGetReplyFromReader(c,&local_30);
  if (iVar1 == -1) {
    c_local._4_4_ = -1;
  }
  else {
    if ((local_30 == (void *)0x0) && (((ulong)reply_local[0x12] & 1) != 0)) {
      do {
        iVar1 = redisBufferWrite((redisContext *)reply_local,(int *)((long)&aux + 4));
        if (iVar1 == -1) {
          return -1;
        }
      } while (aux._4_4_ == 0);
      do {
        iVar1 = redisBufferRead((redisContext *)reply_local);
        if (iVar1 == -1) {
          return -1;
        }
        iVar1 = redisGetReplyFromReader((redisContext *)reply_local,&local_30);
        if (iVar1 == -1) {
          return -1;
        }
      } while (local_30 == (void *)0x0);
    }
    if (ppvStack_20 != (void **)0x0) {
      *ppvStack_20 = local_30;
    }
    c_local._4_4_ = 0;
  }
  return c_local._4_4_;
}

Assistant:

int redisGetReply(redisContext *c, void **reply) {
    int wdone = 0;
    void *aux = NULL;

    /* Try to read pending replies */
    if (redisGetReplyFromReader(c,&aux) == REDIS_ERR)
        return REDIS_ERR;

    /* For the blocking context, flush output buffer and read reply */
    if (aux == NULL && c->flags & REDIS_BLOCK) {
        /* Write until done */
        do {
            if (redisBufferWrite(c,&wdone) == REDIS_ERR)
                return REDIS_ERR;
        } while (!wdone);

        /* Read until there is a reply */
        do {
            if (redisBufferRead(c) == REDIS_ERR)
                return REDIS_ERR;
            if (redisGetReplyFromReader(c,&aux) == REDIS_ERR)
                return REDIS_ERR;
        } while (aux == NULL);
    }

    /* Set reply object */
    if (reply != NULL) *reply = aux;
    return REDIS_OK;
}